

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.cpp
# Opt level: O0

uint __thiscall FS::Focuser::stateError(Focuser *this)

{
  pointer serialDebugArg;
  pointer wifiDebugArg;
  undefined1 local_28 [8];
  WifiDebugOstream log;
  Focuser *this_local;
  
  log._16_8_ = this;
  serialDebugArg =
       std::unique_ptr<DebugInterface,_std::default_delete<DebugInterface>_>::get(&this->debugLog);
  wifiDebugArg = std::unique_ptr<NetInterface,_std::default_delete<NetInterface>_>::get(&this->net);
  WifiDebugOstream::WifiDebugOstream((WifiDebugOstream *)local_28,serialDebugArg,wifiDebugArg);
  ::operator<<((WifiDebugOstream *)local_28,"hep hep hep error error error\n");
  return 10000000;
}

Assistant:

unsigned int Focuser::stateError()
{
  WifiDebugOstream log( debugLog.get(), net.get() );
  log << "hep hep hep error error error\n";
  return 10*1000*1000; // 10 sec pause 
}